

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

CURLcode mqtt_doing(Curl_easy *data,_Bool *done)

{
  size_t *psVar1;
  smb_conn_state sVar2;
  uint uVar3;
  connectdata *pcVar4;
  curl_trc_feat *pcVar5;
  long lVar6;
  _Bool *p_Var7;
  byte bVar8;
  CURLcode CVar9;
  CURLcode CVar10;
  connectdata *conn_2;
  char *pcVar11;
  long lVar12;
  size_t blen;
  long lVar13;
  size_t sVar14;
  connectdata *conn;
  MQTT *pMVar15;
  dynbuf *s;
  bool bVar16;
  uchar recvbyte;
  ssize_t nread;
  byte local_1048;
  undefined7 uStack_1047;
  _Bool *local_1040;
  long local_1038 [513];
  
  pcVar4 = data->conn;
  pMVar15 = (data->req).p.mqtt;
  *done = false;
  if (pMVar15->nsend != 0) {
    pcVar11 = pMVar15->sendleftovers;
    CVar9 = mqtt_send(data,pcVar11,pMVar15->nsend);
    (*Curl_cfree)(pcVar11);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
  }
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)))) {
    Curl_infof(data,"mqtt_doing: state [%d]",(ulong)(pcVar4->proto).smbc.state);
  }
  switch((pcVar4->proto).smbc.state) {
  case SMB_NOT_CONNECTED:
    CVar9 = Curl_xfer_recv(data,(char *)&pMVar15->firstbyte,1,local_1038);
    if (CVar9 != CURLE_OK) break;
    if (local_1038[0] == 0) {
      Curl_failf(data,"Connection disconnected");
      *done = true;
      return CURLE_RECV_ERROR;
    }
    Curl_debug(data,CURLINFO_HEADER_IN,(char *)&pMVar15->firstbyte,1);
    pMVar15->npacket = 0;
    (data->conn->proto).smbc.state = SMB_CONNECTING;
  case SMB_CONNECTING:
    local_1040 = done;
    do {
      CVar10 = Curl_xfer_recv(data,(char *)&local_1048,1,local_1038);
      bVar16 = CVar10 == CURLE_OK;
      if ((!bVar16) || (local_1038[0] == 0)) goto LAB_00141d0a;
      Curl_debug(data,CURLINFO_HEADER_IN,(char *)&local_1048,1);
      sVar14 = pMVar15->npacket;
      pMVar15->npacket = sVar14 + 1;
      pMVar15->pkt_hd[sVar14] = local_1048;
    } while (((char)local_1048 < '\0') && (pMVar15->npacket < 4));
    bVar16 = true;
LAB_00141d0a:
    p_Var7 = local_1040;
    CVar9 = (uint)(local_1048 >> 4 & 8);
    if (local_1038[0] == 0) {
      CVar9 = CVar10;
    }
    if (!bVar16) {
      CVar9 = CVar10;
    }
    if (CVar9 == CURLE_OK) {
      if (pMVar15->npacket == 0) {
        pMVar15->remaining_length = 0;
      }
      else {
        lVar12 = 1;
        lVar13 = 0x48;
        sVar14 = 0;
        do {
          lVar6 = lVar13 + -0x48;
          sVar14 = (ulong)(pMVar15->pkt_hd[lVar6] & 0x7f) * lVar12 + sVar14;
          if (pMVar15->npacket <= lVar13 - 0x47U) break;
          lVar12 = lVar12 << 7;
          lVar13 = lVar13 + 1;
        } while ((char)pMVar15->pkt_hd[lVar6] < '\0');
        pMVar15->remaining_length = sVar14;
        pMVar15->npacket = 0;
        if (sVar14 != 0) {
          sVar2 = (pcVar4->proto).mqtt.nextstate;
          pcVar4 = data->conn;
          (pcVar4->proto).smbc.state = sVar2;
          if (sVar2 != SMB_NOT_CONNECTED) {
            return CURLE_OK;
          }
          (pcVar4->proto).mqtt.nextstate = MQTT_NOSTATE;
          return CURLE_OK;
        }
      }
      (data->conn->proto).ftpc.pp.nread_resp = 0;
      if (pMVar15->firstbyte != 0xe0) {
        return CURLE_OK;
      }
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data,"Got DISCONNECT");
      }
      *p_Var7 = true;
      return CURLE_OK;
    }
    break;
  case SMB_NEGOTIATE:
    pMVar15 = (data->req).p.mqtt;
    CVar9 = mqtt_recv_atleast(data,2);
    if (CVar9 == CURLE_OK) {
      s = &pMVar15->recvbuf;
      pcVar11 = Curl_dyn_ptr(s);
      Curl_debug(data,CURLINFO_HEADER_IN,pcVar11,2);
      if (*pcVar11 != '\0' || pcVar11[1] != '\0') {
        Curl_failf(data,"Expected %02x%02x but got %02x%02x",0,0,(ulong)(uint)(int)*pcVar11,
                   (ulong)(uint)(int)pcVar11[1]);
        Curl_dyn_reset(s);
        return CURLE_WEIRD_SERVER_REPLY;
      }
      mqtt_recv_consume((Curl_easy *)(data->req).p.file,2);
      if ((data->state).httpreq == '\x01') {
        CVar9 = mqtt_publish(data);
        if (CVar9 == CURLE_OK) {
          CVar9 = mqtt_disconnect(data);
          *done = true;
        }
        (pcVar4->proto).mqtt.nextstate = MQTT_FIRST;
      }
      else {
        CVar9 = mqtt_subscribe(data);
        if (CVar9 == CURLE_OK) {
          (data->conn->proto).ftpc.pp.nread_resp = 0x300000000;
          return CURLE_OK;
        }
      }
    }
    break;
  case SMB_SETUP:
  case SMB_CONNECTED|SMB_CONNECTING:
  case SMB_CONNECTED|SMB_NEGOTIATE:
    pcVar4 = data->conn;
    sVar2 = (pcVar4->proto).smbc.state;
    CVar9 = CURLE_WEIRD_SERVER_REPLY;
    if (3 < sVar2 - SMB_SETUP) break;
    pMVar15 = (data->req).p.mqtt;
    switch(sVar2) {
    default:
      bVar8 = pMVar15->firstbyte & 0xf0;
      if (bVar8 == 0x30) {
        (pcVar4->proto).smbc.state = SMB_CONNECTED|SMB_NEGOTIATE;
        sVar14 = pMVar15->remaining_length;
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))
           )) {
          Curl_infof(data,"Remaining length: %zu bytes",sVar14);
        }
        lVar12 = (data->set).max_filesize;
        if (lVar12 < (long)sVar14 && lVar12 != 0) {
          Curl_failf(data,"Maximum file size exceeded");
          CVar9 = CURLE_FILESIZE_EXCEEDED;
          goto LAB_00141fa7;
        }
        Curl_pgrsSetDownloadSize(data,sVar14);
        (data->req).bytecount = 0;
        (data->req).size = sVar14;
        pMVar15->npacket = sVar14;
        goto LAB_00141bf3;
      }
      if (bVar8 != 0xe0) {
        if (bVar8 != 0x90) goto LAB_00141fa7;
        (pcVar4->proto).smbc.state = SMB_CONNECTED;
        pMVar15 = (data->req).p.mqtt;
        goto switchD_00141a5b_caseD_4;
      }
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data,"Got DISCONNECT");
      }
      *done = true;
      break;
    case SMB_CONNECTED:
switchD_00141a5b_caseD_4:
      CVar9 = mqtt_recv_atleast(data,3);
      if (CVar9 != CURLE_OK) goto LAB_00141fa7;
      pcVar11 = Curl_dyn_ptr(&pMVar15->recvbuf);
      Curl_debug(data,CURLINFO_HEADER_IN,pcVar11,3);
      uVar3 = (pcVar4->proto).mqtt.packetid;
      if (((*pcVar11 != (char)(uVar3 >> 8)) || (pcVar11[1] != (char)uVar3)) || (pcVar11[2] != '\0'))
      {
        Curl_dyn_reset(&pMVar15->recvbuf);
        CVar9 = CURLE_WEIRD_SERVER_REPLY;
        goto LAB_00141fa7;
      }
      mqtt_recv_consume((Curl_easy *)(data->req).p.file,3);
      (data->conn->proto).tftpc = (tftp_state_data *)0x500000000;
      break;
    case SMB_CONNECTED|SMB_NEGOTIATE:
      sVar14 = pMVar15->npacket;
LAB_00141bf3:
      blen = 0x1000;
      if (sVar14 < 0x1000) {
        blen = sVar14;
      }
      CVar9 = Curl_xfer_recv(data,(char *)local_1038,blen,(ssize_t *)&local_1048);
      if (CVar9 == CURLE_OK) {
        if (CONCAT71(uStack_1047,local_1048) != 0) {
          CVar9 = Curl_client_write(data,1,(char *)local_1038,CONCAT71(uStack_1047,local_1048));
          if (CVar9 == CURLE_OK) {
            psVar1 = &pMVar15->npacket;
            *psVar1 = *psVar1 - CONCAT71(uStack_1047,local_1048);
            CVar9 = CURLE_OK;
            if (*psVar1 == 0) {
              (data->conn->proto).tftpc = (tftp_state_data *)0x500000000;
              CVar9 = CURLE_OK;
            }
          }
          goto LAB_00141fa7;
        }
        CVar9 = CURLE_PARTIAL_FILE;
        if ((((data->set).field_0x8cd & 0x10) == 0) ||
           ((pcVar5 = (data->state).feat, pcVar5 != (curl_trc_feat *)0x0 && (pcVar5->log_level < 1))
           )) goto LAB_00141fa7;
        pcVar11 = "server disconnected";
      }
      else {
        if (((CVar9 != CURLE_AGAIN) || (CVar9 = CURLE_AGAIN, ((data->set).field_0x8cd & 0x10) == 0))
           || ((pcVar5 = (data->state).feat, pcVar5 != (curl_trc_feat *)0x0 &&
               (pcVar5->log_level < 1)))) goto LAB_00141fa7;
        pcVar11 = "EEEE AAAAGAIN";
      }
      Curl_infof(data,pcVar11);
      goto LAB_00141fa7;
    }
    CVar9 = CURLE_OK;
    break;
  default:
    Curl_failf(data,"State not handled yet");
    *done = true;
    return CURLE_OK;
  }
LAB_00141fa7:
  CVar10 = CURLE_OK;
  if (CVar9 != CURLE_AGAIN) {
    CVar10 = CVar9;
  }
  return CVar10;
}

Assistant:

static CURLcode mqtt_doing(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct mqtt_conn *mqtt = &conn->proto.mqtt;
  struct MQTT *mq = data->req.p.mqtt;
  ssize_t nread;
  unsigned char recvbyte;

  *done = FALSE;

  if(mq->nsend) {
    /* send the remainder of an outgoing packet */
    char *ptr = mq->sendleftovers;
    result = mqtt_send(data, mq->sendleftovers, mq->nsend);
    free(ptr);
    if(result)
      return result;
  }

  infof(data, "mqtt_doing: state [%d]", (int) mqtt->state);
  switch(mqtt->state) {
  case MQTT_FIRST:
    /* Read the initial byte only */
    result = Curl_xfer_recv(data, (char *)&mq->firstbyte, 1, &nread);
    if(result)
      break;
    else if(!nread) {
      failf(data, "Connection disconnected");
      *done = TRUE;
      result = CURLE_RECV_ERROR;
      break;
    }
    Curl_debug(data, CURLINFO_HEADER_IN, (char *)&mq->firstbyte, 1);
    /* remember the first byte */
    mq->npacket = 0;
    mqstate(data, MQTT_REMAINING_LENGTH, MQTT_NOSTATE);
    FALLTHROUGH();
  case MQTT_REMAINING_LENGTH:
    do {
      result = Curl_xfer_recv(data, (char *)&recvbyte, 1, &nread);
      if(result || !nread)
        break;
      Curl_debug(data, CURLINFO_HEADER_IN, (char *)&recvbyte, 1);
      mq->pkt_hd[mq->npacket++] = recvbyte;
    } while((recvbyte & 0x80) && (mq->npacket < 4));
    if(!result && nread && (recvbyte & 0x80))
      /* MQTT supports up to 127 * 128^0 + 127 * 128^1 + 127 * 128^2 +
         127 * 128^3 bytes. server tried to send more */
      result = CURLE_WEIRD_SERVER_REPLY;
    if(result)
      break;
    mq->remaining_length = mqtt_decode_len(mq->pkt_hd, mq->npacket, NULL);
    mq->npacket = 0;
    if(mq->remaining_length) {
      mqstate(data, mqtt->nextstate, MQTT_NOSTATE);
      break;
    }
    mqstate(data, MQTT_FIRST, MQTT_FIRST);

    if(mq->firstbyte == MQTT_MSG_DISCONNECT) {
      infof(data, "Got DISCONNECT");
      *done = TRUE;
    }
    break;
  case MQTT_CONNACK:
    result = mqtt_verify_connack(data);
    if(result)
      break;

    if(data->state.httpreq == HTTPREQ_POST) {
      result = mqtt_publish(data);
      if(!result) {
        result = mqtt_disconnect(data);
        *done = TRUE;
      }
      mqtt->nextstate = MQTT_FIRST;
    }
    else {
      result = mqtt_subscribe(data);
      if(!result) {
        mqstate(data, MQTT_FIRST, MQTT_SUBACK);
      }
    }
    break;

  case MQTT_SUBACK:
  case MQTT_PUBWAIT:
  case MQTT_PUB_REMAIN:
    result = mqtt_read_publish(data, done);
    break;

  default:
    failf(data, "State not handled yet");
    *done = TRUE;
    break;
  }

  if(result == CURLE_AGAIN)
    result = CURLE_OK;
  return result;
}